

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cpp
# Opt level: O3

QString * formatFunctionSignature(QString *__return_storage_ptr__,QList<Tracepoint::Argument> *args)

{
  Argument *pAVar1;
  long lVar2;
  bool bVar3;
  QString *ret;
  long lVar4;
  long in_FS_OFFSET;
  QLatin1StringView str;
  QAnyStringView a;
  QAnyStringView a_00;
  QString local_80;
  QString local_68;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pAVar1 = (args->d).ptr;
  lVar2 = (args->d).size;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (lVar2 != 0) {
    bVar3 = true;
    lVar4 = 0;
    do {
      if (!bVar3) {
        str.m_size = 2;
        str.m_data = ", ";
        QString::append(__return_storage_ptr__,str);
      }
      local_68.d.d = (Data *)0x0;
      local_68.d.ptr = L"%1 %2";
      local_68.d.size = 5;
      a.m_size = *(long *)((long)&(pAVar1->type).d.size + lVar4) * 4 + 2;
      a.field_0.m_data =
           ((anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)((long)&(pAVar1->type).d.ptr + lVar4))->
           m_data;
      QString::arg_impl(&local_50,&local_68,a,0,(QChar)0x20);
      a_00.m_size = *(long *)((long)&(pAVar1->name).d.size + lVar4) * 4 + 2;
      a_00.field_0.m_data =
           ((anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)((long)&(pAVar1->name).d.ptr + lVar4))->
           m_data;
      QString::arg_impl(&local_80,&local_50,a_00,0,(QChar)0x20);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
        }
      }
      QString::append(__return_storage_ptr__,&local_80);
      if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
        }
      }
      lVar4 = lVar4 + 0x38;
      bVar3 = false;
    } while (lVar2 * 0x38 - lVar4 != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString formatFunctionSignature(const QList<Tracepoint::Argument> &args)
{
    return joinArguments(args, [](const Tracepoint::Argument &arg) {
            return QStringLiteral("%1 %2").arg(arg.type).arg(arg.name);
    });
}